

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O0

optional<int> obj::read_index(char **ptr)

{
  int iVar1;
  long lVar2;
  int local_28 [2];
  int index;
  char *base;
  char **ptr_local;
  
  _index = *ptr;
  base = (char *)ptr;
  _index = strip_spaces(_index);
  iVar1 = isdigit((int)*_index);
  if ((iVar1 == 0) && (*_index != '-')) {
    std::optional<int>::optional((optional<int> *)&ptr_local);
  }
  else {
    lVar2 = strtol(_index,(char **)&index,10);
    local_28[0] = (int)lVar2;
    _index = strip_spaces(_index);
    if (*_index == '/') {
      _index = _index + 1;
      if (*_index != '/') {
        strtol(_index,(char **)&index,10);
      }
      _index = strip_spaces(_index);
      if (*_index == '/') {
        _index = _index + 1;
        strtol(_index,(char **)&index,10);
      }
    }
    *(char **)base = _index;
    ptr_local = (char **)std::make_optional<int&>(local_28);
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)ptr_local;
}

Assistant:

inline std::optional<int> read_index(char** ptr) {
    char* base = *ptr;

    // Detect end of line (negative indices are supported) 
    base = strip_spaces(base);
    if (!std::isdigit(*base) && *base != '-')
        return std::nullopt;

    int index = std::strtol(base, &base, 10);
    base = strip_spaces(base);

    if (*base == '/') {
        base++;

        // Handle the case when there is no texture coordinate
        if (*base != '/')
            std::strtol(base, &base, 10);

        base = strip_spaces(base);

        if (*base == '/') {
            base++;
            std::strtol(base, &base, 10);
        }
    }

    *ptr = base;
    return std::make_optional(index);
}